

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O3

void __thiscall VariationalBayesEstimatorOnLDA::updateQz(VariationalBayesEstimatorOnLDA *this)

{
  uint uVar1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar2;
  pointer pvVar3;
  integral_constant<int,_53> *t;
  integral_constant<int,_53> *t_00;
  integral_constant<int,_53> *t_01;
  integral_constant<int,_53> *t_02;
  integral_constant<int,_53> *extraout_RDX;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *ppVar4;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *ppVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  longdouble in_ST0;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  double dVar12;
  detail local_b4;
  detail local_b3;
  detail local_b2;
  detail local_b1;
  double local_b0;
  double local_a8;
  longdouble local_9c;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  pvVar2 = this->_docVoca;
  pvVar3 = (pvVar2->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar2->
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar3) {
    ppVar5 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
              *)0x0;
    local_9c = (longdouble)1.79769313486232e+308;
    do {
      t = (integral_constant<int,_53> *)
          pvVar3[(long)ppVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start;
      local_90 = ppVar5;
      if ((integral_constant<int,_53> *)
          pvVar3[(long)ppVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish != t) {
        uVar6 = this->_K;
        uVar8 = 0;
        do {
          bVar10 = uVar6 != 0;
          uVar6 = 0;
          if (bVar10) {
            uVar6 = *(uint *)(t + uVar8 * 4);
            local_78 = 0.0;
            lVar9 = 0;
            uVar7 = 0;
            lVar11 = in_ST3;
            do {
              local_38 = *(double *)
                          (*(long *)((long)&(((this->_nkv).
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data + lVar9) +
                          (ulong)uVar6 * 8) +
                         (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar6];
              local_a8 = *(double *)
                          (*(long *)&(this->_ndk).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(long)ppVar5].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + uVar7 * 8) +
                         (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar7];
              local_b0 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar7] + this->_betaSum;
              local_80 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)local_90] + this->_alphaSum;
              ppVar4 = local_90;
              boost::math::detail::
              digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((longdouble *)0x0,&local_b4,(longdouble)local_38,t,local_90);
              in_ST3 = in_ST6;
              if (local_9c < ABS(in_ST0)) {
                boost::math::policies::detail::raise_error<std::overflow_error,double>
                          ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              }
              local_40 = (double)in_ST0;
              local_88 = exp(local_40);
              local_48 = local_a8;
              in_ST0 = in_ST4;
              boost::math::detail::
              digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((longdouble *)0x0,&local_b3,(longdouble)local_a8,t_00,ppVar4);
              in_ST4 = in_ST3;
              if (local_9c < ABS(in_ST1)) {
                boost::math::policies::detail::raise_error<std::overflow_error,double>
                          ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              }
              local_50 = (double)in_ST1;
              local_a8 = exp(local_50);
              local_58 = local_b0;
              in_ST1 = in_ST5;
              boost::math::detail::
              digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((longdouble *)0x0,&local_b2,(longdouble)local_b0,t_01,ppVar4);
              in_ST5 = in_ST4;
              if (local_9c < ABS(in_ST2)) {
                boost::math::policies::detail::raise_error<std::overflow_error,double>
                          ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              }
              local_60 = (double)in_ST2;
              local_b0 = exp(local_60);
              local_68 = local_80;
              in_ST2 = in_ST6;
              boost::math::detail::
              digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((longdouble *)0x0,&local_b1,(longdouble)local_80,t_02,ppVar4);
              in_ST6 = in_ST5;
              if (local_9c < ABS(lVar11)) {
                boost::math::policies::detail::raise_error<std::overflow_error,double>
                          ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              }
              local_70 = (double)lVar11;
              dVar12 = exp(local_70);
              dVar12 = (local_88 * local_a8) / (local_b0 * dVar12);
              local_78 = local_78 + dVar12;
              *(double *)
               (*(long *)(*(long *)&(this->_qz).
                                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(long)ppVar5].
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data + uVar8 * 0x18) + uVar7 * 8) =
                   dVar12;
              uVar7 = uVar7 + 1;
              uVar1 = this->_K;
              lVar9 = lVar9 + 0x18;
              t = extraout_RDX;
              lVar11 = in_ST3;
            } while (uVar7 < uVar1);
            uVar6 = 0;
            if (uVar1 != 0) {
              lVar9 = *(long *)(*(long *)&(this->_qz).
                                          super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(long)ppVar5].
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data + uVar8 * 0x18);
              uVar7 = 0;
              do {
                *(double *)(lVar9 + uVar7 * 8) = *(double *)(lVar9 + uVar7 * 8) / local_78;
                uVar7 = uVar7 + 1;
                uVar6 = uVar1;
              } while (uVar1 != uVar7);
            }
          }
          uVar8 = uVar8 + 1;
          pvVar2 = this->_docVoca;
          pvVar3 = (pvVar2->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          t = (integral_constant<int,_53> *)
              pvVar3[(long)ppVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)pvVar3[(long)ppVar5].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)t >> 2));
      }
      ppVar5 = local_90 + 1;
      ppVar4 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                *)(((long)(pvVar2->
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                  -0x5555555555555555);
    } while (ppVar5 <= ppVar4 && (long)ppVar4 - (long)ppVar5 != 0);
  }
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateQz(){//{{{
    for(int d=0;d<_docVoca.size();d++){
        for(int l=0; l<_docVoca[d].size(); l++){
            double Zq = 0;
            unsigned int v = _docVoca[d][l];
            for(int k=0; k<_K; k++){
                double term1 = 0, term2 = 0, term3 = 0, term4 = 0;
                double xikv = _nkv[k][v] + _beta[v];
                double xidk = _ndk[d][k] + _alpha[k];
                double xik = _nk[k] + _betaSum;
                double xid = _nd[d] + _alphaSum;
                try{
                    term1 = exp(boost::math::digamma(xikv));
                }catch(...){
                    term1 = 0;
                }
                try{
                    term2 = exp(boost::math::digamma(xidk));
                }catch(...){
                    term2 = 0;
                }
                try{
                    term3 = exp(boost::math::digamma(xik));
                }catch(...){
                    term3 = 0;
                }
                try{
                    term4 = exp(boost::math::digamma(xid));
                }catch(...){
                    term4 = 0;
                }
                double constProbability = (term1 * term2) / (term3 * term4);
                Zq += constProbability;
                _qz[d][l][k] = constProbability;
            }
            for(int k=0; k<_K; k++){
                _qz[d][l][k] /= Zq;
            }
        }
    }
}